

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

lyd_node * lyd_parse_data_(ly_ctx *ctx,char *data,LYD_FORMAT format,int options,__va_list_tag *ap)

{
  uint uVar1;
  int iVar2;
  LY_ERR *pLVar3;
  long *local_78;
  long *local_60;
  lyd_node *local_48;
  lyd_node *iter;
  lyd_node *data_tree;
  lyd_node *rpc_act;
  __va_list_tag *ap_local;
  int options_local;
  LYD_FORMAT format_local;
  char *data_local;
  ly_ctx *ctx_local;
  
  data_tree = (lyd_node *)0x0;
  iter = (lyd_node *)0x0;
  iVar2 = lyp_check_options(options);
  if (iVar2 == 0) {
    if ((options & 0x20U) != 0) {
      uVar1 = ap->gp_offset;
      if (uVar1 < 0x29) {
        local_60 = (long *)((long)(int)uVar1 + (long)ap->reg_save_area);
        ap->gp_offset = uVar1 + 8;
      }
      else {
        local_60 = (long *)ap->overflow_arg_area;
        ap->overflow_arg_area = local_60 + 1;
      }
      data_tree = (lyd_node *)*local_60;
      if (((data_tree == (lyd_node *)0x0) || (data_tree->parent != (lyd_node *)0x0)) ||
         ((data_tree->schema->nodetype & (LYS_RPC|LYS_LIST|LYS_CONTAINER)) == LYS_UNKNOWN)) {
        pLVar3 = ly_errno_location();
        *pLVar3 = LY_EINVAL;
        ly_log(LY_LLERR,"%s: invalid variable parameter (const struct lyd_node *rpc_act).",
               "lyd_parse_data_");
        return (lyd_node *)0x0;
      }
    }
    if ((options & 0x70U) != 0) {
      uVar1 = ap->gp_offset;
      if (uVar1 < 0x29) {
        local_78 = (long *)((long)(int)uVar1 + (long)ap->reg_save_area);
        ap->gp_offset = uVar1 + 8;
      }
      else {
        local_78 = (long *)ap->overflow_arg_area;
        ap->overflow_arg_area = local_78 + 1;
      }
      iter = (lyd_node *)*local_78;
      local_48 = iter;
      if (iter != (lyd_node *)0x0) {
        for (; local_48 != (lyd_node *)0x0; local_48 = local_48->next) {
          if (local_48->parent != (lyd_node *)0x0) {
            pLVar3 = ly_errno_location();
            *pLVar3 = LY_EINVAL;
            ly_log(LY_LLERR,"%s: invalid variable parameter (const struct lyd_node *data_tree).",
                   "lyd_parse_data_");
            return (lyd_node *)0x0;
          }
        }
        while (iter->prev->next != (lyd_node *)0x0) {
          iter = iter->prev;
        }
        if ((options & 0x1000U) != 0) {
          pLVar3 = ly_errno_location();
          *pLVar3 = LY_EINVAL;
          ly_log(LY_LLERR,
                 "%s: invalid parameter (variable arg const struct lyd_node *data_tree with LYD_OPT_NOSIBLINGS)."
                 ,"lyd_parse_data_");
          return (lyd_node *)0x0;
        }
      }
    }
    ctx_local = (ly_ctx *)lyd_parse_(ctx,data_tree,data,format,options,iter);
  }
  else {
    pLVar3 = ly_errno_location();
    *pLVar3 = LY_EINVAL;
    ly_log(LY_LLERR,"%s: Invalid options (multiple data type flags set).","lyd_parse_data_");
    ctx_local = (ly_ctx *)0x0;
  }
  return (lyd_node *)ctx_local;
}

Assistant:

static struct lyd_node *
lyd_parse_data_(struct ly_ctx *ctx, const char *data, LYD_FORMAT format, int options, va_list ap)
{
    const struct lyd_node *rpc_act = NULL, *data_tree = NULL, *iter;

    if (lyp_check_options(options)) {
        LOGERR(LY_EINVAL, "%s: Invalid options (multiple data type flags set).", __func__);
        return NULL;
    }

    if (options & LYD_OPT_RPCREPLY) {
        rpc_act = va_arg(ap, const struct lyd_node *);
        if (!rpc_act || rpc_act->parent || !(rpc_act->schema->nodetype & (LYS_RPC | LYS_LIST | LYS_CONTAINER))) {
            LOGERR(LY_EINVAL, "%s: invalid variable parameter (const struct lyd_node *rpc_act).", __func__);
            return NULL;
        }
    }
    if (options & (LYD_OPT_RPC | LYD_OPT_NOTIF | LYD_OPT_RPCREPLY)) {
        data_tree = va_arg(ap, const struct lyd_node *);
        if (data_tree) {
            LY_TREE_FOR(data_tree, iter) {
                if (iter->parent) {
                    /* a sibling is not top-level */
                    LOGERR(LY_EINVAL, "%s: invalid variable parameter (const struct lyd_node *data_tree).", __func__);
                    return NULL;
                }
            }

            /* move it to the beginning */
            for (; data_tree->prev->next; data_tree = data_tree->prev);

            /* LYD_OPT_NOSIBLINGS cannot be set in this case */
            if (options & LYD_OPT_NOSIBLINGS) {
                LOGERR(LY_EINVAL, "%s: invalid parameter (variable arg const struct lyd_node *data_tree with LYD_OPT_NOSIBLINGS).", __func__);
                return NULL;
            }
        }
    }

    return lyd_parse_(ctx, rpc_act, data, format, options, data_tree);
}